

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::Arg::commands_abi_cxx11_
          (string *__return_storage_ptr__,Arg *this)

{
  bool bVar1;
  bool bVar2;
  reference pbVar3;
  ulong uVar4;
  ostream *poVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8;
  const_iterator itEnd;
  const_iterator it;
  ostringstream local_190 [7];
  bool first;
  ostringstream oss;
  Arg *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  bVar1 = true;
  itEnd = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin(&(this->super_OptionArgProperties).shortNames);
  local_1a8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&(this->super_OptionArgProperties).shortNames);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&itEnd,&local_1a8);
    if (!bVar2) break;
    if (bVar1) {
      bVar1 = false;
    }
    else {
      std::operator<<((ostream *)local_190,", ");
    }
    poVar5 = std::operator<<((ostream *)local_190,"-");
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&itEnd);
    std::operator<<(poVar5,(string *)pbVar3);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&itEnd);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    if (!bVar1) {
      std::operator<<((ostream *)local_190,", ");
    }
    poVar5 = std::operator<<((ostream *)local_190,"--");
    std::operator<<(poVar5,(string *)&(this->super_OptionArgProperties).longName);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)local_190," <");
    poVar5 = std::operator<<(poVar5,(string *)
                                    &(this->super_CommonArgProperties<Catch::ConfigData>).
                                     placeholder);
    std::operator<<(poVar5,">");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string commands() const {
                std::ostringstream oss;
                bool first = true;
                std::vector<std::string>::const_iterator it = shortNames.begin(), itEnd = shortNames.end();
                for(; it != itEnd; ++it ) {
                    if( first )
                        first = false;
                    else
                        oss << ", ";
                    oss << "-" << *it;
                }
                if( !longName.empty() ) {
                    if( !first )
                        oss << ", ";
                    oss << "--" << longName;
                }
                if( !placeholder.empty() )
                    oss << " <" << placeholder << ">";
                return oss.str();
            }